

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

BrokenCapFactory * capnp::_::readGlobalBrokenCapFactoryForLayoutCpp(void)

{
  return globalBrokenCapFactory;
}

Assistant:

static BrokenCapFactory* readGlobalBrokenCapFactoryForLayoutCpp() {
#if __GNUC__ || defined(__clang__)
  // Thread-sanitizer doesn't have the right information to know this is safe without doing an
  // atomic read. https://groups.google.com/g/capnproto/c/634juhn5ap0/m/pyRiwWl1AAAJ
  return __atomic_load_n(&globalBrokenCapFactory, __ATOMIC_RELAXED);
#else
  return globalBrokenCapFactory;
#endif
}